

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS ref_gather_node_metric(REF_NODE ref_node,FILE *file)

{
  uint uVar1;
  double local_98;
  int local_90;
  int local_88;
  int local_84;
  int local_80;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS status;
  REF_INT im;
  REF_INT i;
  REF_INT n;
  REF_INT local;
  REF_GLOB first;
  REF_GLOB nnode_written;
  REF_GLOB global;
  REF_DBL *xyzm;
  REF_DBL *local_xyzm;
  REF_MPI pRStack_28;
  REF_INT chunk;
  REF_MPI ref_mpi;
  FILE *file_local;
  REF_NODE ref_node_local;
  
  pRStack_28 = ref_node->ref_mpi;
  local_84 = (int)(ref_node->old_n_global / (long)pRStack_28->n) + 1;
  if (pRStack_28->reduce_byte_limit < 1) {
    local_80 = 0x7fffffff;
  }
  else {
    local_80 = pRStack_28->reduce_byte_limit / 0x38;
  }
  if (local_80 <= local_84) {
    if (pRStack_28->reduce_byte_limit < 1) {
      local_88 = 0x7fffffff;
    }
    else {
      local_88 = pRStack_28->reduce_byte_limit / 0x38;
    }
    local_84 = local_88;
  }
  local_xyzm._4_4_ = local_84;
  ref_mpi = (REF_MPI)file;
  file_local = (FILE *)ref_node;
  if (local_84 * 7 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x509,
           "ref_gather_node_metric","malloc local_xyzm of REF_DBL negative");
    ref_node_local._4_4_ = 1;
  }
  else {
    xyzm = (REF_DBL *)malloc((long)(local_84 * 7) << 3);
    if (xyzm == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x509,"ref_gather_node_metric","malloc local_xyzm of REF_DBL NULL");
      ref_node_local._4_4_ = 2;
    }
    else if (local_xyzm._4_4_ * 7 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x50a,"ref_gather_node_metric","malloc xyzm of REF_DBL negative");
      ref_node_local._4_4_ = 1;
    }
    else {
      global = (REF_GLOB)malloc((long)(local_xyzm._4_4_ * 7) << 3);
      if ((void *)global == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x50a,"ref_gather_node_metric","malloc xyzm of REF_DBL NULL");
        ref_node_local._4_4_ = 2;
      }
      else {
        first = 0;
        while (first < (long)file_local->_chain) {
          _n = first;
          if ((long)local_xyzm._4_4_ < (long)file_local->_chain - first) {
            local_90 = local_xyzm._4_4_;
          }
          else {
            local_90 = (int)file_local->_chain - (int)first;
          }
          first = local_90 + first;
          for (status = 0;
              SBORROW4(status,local_xyzm._4_4_ * 7) != status + local_xyzm._4_4_ * -7 < 0;
              status = status + 1) {
            xyzm[status] = 0.0;
          }
          for (status = 0; status < local_90; status = status + 1) {
            nnode_written = _n + status;
            uVar1 = ::ref_node_local((REF_NODE)file_local,nnode_written,&i);
            if ((uVar1 != 0) && (uVar1 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x519,"ref_gather_node_metric",(ulong)uVar1,"node local failed");
              return uVar1;
            }
            if ((uVar1 == 0) &&
               (pRStack_28->id == *(int *)(file_local->_IO_write_ptr + (long)i * 4))) {
              uVar1 = ref_node_metric_get((REF_NODE)file_local,i,xyzm + status * 7);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x51c,"ref_gather_node_metric",(ulong)uVar1,"get");
                return uVar1;
              }
              xyzm[status * 7 + 6] = 1.0;
            }
            else {
              for (ref_private_macro_code_rxs = 0; ref_private_macro_code_rxs < 7;
                  ref_private_macro_code_rxs = ref_private_macro_code_rxs + 1) {
                xyzm[ref_private_macro_code_rxs + status * 7] = 0.0;
              }
            }
          }
          uVar1 = ref_mpi_sum(pRStack_28,xyzm,(void *)global,local_90 * 7,3);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x523,"ref_gather_node_metric",(ulong)uVar1,"sum");
            return uVar1;
          }
          if (pRStack_28->id == 0) {
            for (status = 0; status < local_90; status = status + 1) {
              if (*(double *)(global + (long)(status * 7 + 6) * 8) - 1.0 <= 0.0) {
                local_98 = -(*(double *)(global + (long)(status * 7 + 6) * 8) - 1.0);
              }
              else {
                local_98 = *(double *)(global + (long)(status * 7 + 6) * 8) - 1.0;
              }
              if (0.1 < local_98) {
                printf("error gather node %ld %f\n",
                       *(undefined8 *)(global + (long)(status * 7 + 6) * 8),_n + status);
              }
              fprintf((FILE *)ref_mpi,"%.15e %.15e %.15e %.15e %.15e %.15e \n",
                      *(undefined8 *)(global + (long)(status * 7) * 8),
                      *(undefined8 *)(global + (long)(status * 7 + 1) * 8),
                      *(undefined8 *)(global + (long)(status * 7 + 2) * 8),
                      *(undefined8 *)(global + (long)(status * 7 + 3) * 8),
                      *(undefined8 *)(global + (long)(status * 7 + 4) * 8),
                      *(undefined8 *)(global + (long)(status * 7 + 5) * 8));
            }
          }
        }
        if (global != 0) {
          free((void *)global);
        }
        if (xyzm != (REF_DBL *)0x0) {
          free(xyzm);
        }
        ref_node_local._4_4_ = 0;
      }
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node_metric(REF_NODE ref_node,
                                                 FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_GLOB global, nnode_written, first;
  REF_INT local, n, i, im;
  REF_STATUS status;

  chunk = (REF_INT)(ref_node_n_global(ref_node) / ref_mpi_n(ref_mpi) + 1);
  chunk = MIN(
      chunk, ref_mpi_reduce_chunk_limit(ref_mpi, 7 * (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, 7 * chunk, REF_DBL);
  ref_malloc(xyzm, 7 * chunk, REF_DBL);

  nnode_written = 0;
  while (nnode_written < ref_node_n_global(ref_node)) {
    first = nnode_written;
    n = (REF_INT)MIN((REF_GLOB)chunk,
                     ref_node_n_global(ref_node) - nnode_written);

    nnode_written += n;

    for (i = 0; i < 7 * chunk; i++) local_xyzm[i] = 0.0;

    for (i = 0; i < n; i++) {
      global = first + i;
      status = ref_node_local(ref_node, global, &local);
      RXS(status, REF_NOT_FOUND, "node local failed");
      if (REF_SUCCESS == status &&
          ref_mpi_rank(ref_mpi) == ref_node_part(ref_node, local)) {
        RSS(ref_node_metric_get(ref_node, local, &(local_xyzm[7 * i])), "get");
        local_xyzm[6 + 7 * i] = 1.0;
      } else {
        for (im = 0; im < 7; im++) local_xyzm[im + 7 * i] = 0.0;
      }
    }

    RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, 7 * n, REF_DBL_TYPE), "sum");

    if (ref_mpi_once(ref_mpi))
      for (i = 0; i < n; i++) {
        if (ABS(xyzm[6 + 7 * i] - 1.0) > 0.1) {
          printf("error gather node " REF_GLOB_FMT " %f\n", first + i,
                 xyzm[6 + 7 * i]);
        }
        fprintf(file, "%.15e %.15e %.15e %.15e %.15e %.15e \n", xyzm[0 + 7 * i],
                xyzm[1 + 7 * i], xyzm[2 + 7 * i], xyzm[3 + 7 * i],
                xyzm[4 + 7 * i], xyzm[5 + 7 * i]);
      }
  }

  ref_free(xyzm);
  ref_free(local_xyzm);

  return REF_SUCCESS;
}